

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
llvm::sys::Process::FindInEnvPath
          (Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,StringRef EnvName,StringRef FileName,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          IgnoreList)

{
  StringRef Source;
  Child *pCVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  long lVar10;
  size_type sVar11;
  Child CVar12;
  StringRef Name;
  StringRef Delimiters;
  char EnvPathSeparatorStr [2];
  StringRef Dir;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> OptPath
  ;
  SmallString<128U> FilePath;
  SmallVector<llvm::StringRef,_8U> Dirs;
  Child local_210;
  undefined8 local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  char local_1ea [2];
  char *local_1e8;
  Child CStack_1e0;
  long *local_1d0;
  size_t local_1c8;
  long local_1c0 [2];
  bool local_1b0;
  StringRef local_1a8;
  Twine local_198;
  Twine local_180;
  char **local_168;
  ulong local_160;
  char *local_158 [16];
  Twine local_d8;
  Child local_c0;
  ulong local_b8;
  Twine local_b0 [5];
  
  local_1a8.Length = FileName.Length;
  pcVar7 = FileName.Data;
  Name.Data = (char *)EnvName.Length;
  local_1a8.Data = pcVar7;
  Twine::Twine((Twine *)&local_c0,&local_1a8);
  bVar3 = sys::path::is_absolute((Twine *)&local_c0,native);
  if (bVar3) {
    __assert_fail("!path::is_absolute(FileName)",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Process.cpp"
                  ,0x26,
                  "static Optional<std::string> llvm::sys::Process::FindInEnvPath(StringRef, StringRef, ArrayRef<std::string>)"
                 );
  }
  (__return_storage_ptr__->Storage).hasVal = false;
  Name.Length = (size_t)pcVar7;
  GetEnv_abi_cxx11_((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1d0,(Process *)EnvName.Data,Name);
  if (local_1b0 == true) {
    local_1ea[0] = ':';
    local_1ea[1] = '\0';
    local_c0.twine = local_b0;
    local_b8 = 0x800000000;
    Source.Length = local_1c8;
    Source.Data = (char *)local_1d0;
    sVar5 = strlen(local_1ea);
    Delimiters.Length = sVar5;
    Delimiters.Data = local_1ea;
    SplitString(Source,(SmallVectorImpl<llvm::StringRef> *)&local_c0,Delimiters);
    uVar6 = local_b8 & 0xffffffff;
    if (uVar6 != 0) {
      pCVar1 = &(local_c0.twine)->LHS;
      CVar12 = local_c0;
      do {
        local_1e8 = ((Child *)&(CVar12.stringRef)->Data)->cString;
        CStack_1e0 = ((Child *)&(CVar12.smallString)->super_SmallVectorTemplateBase<char,_true>)[1];
        if (CStack_1e0.twine != (Twine *)0x0) {
          lVar8 = IgnoreList.Length * 0x20;
          local_168 = &local_1e8;
          pbVar9 = IgnoreList.Data;
          sVar11 = IgnoreList.Length;
          if (0 < (long)IgnoreList.Length >> 2) {
            lVar10 = ((long)IgnoreList.Length >> 2) + 1;
            pbVar2 = IgnoreList.Data + 2;
            do {
              pbVar9 = pbVar2;
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                      ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                    *)&local_168,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pbVar9[-2]._M_dataplus._M_p);
              if (bVar3) {
                pbVar9 = pbVar9 + -2;
                goto LAB_001274df;
              }
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                      ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                    *)&local_168,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pbVar9[-1]._M_dataplus._M_p);
              if (bVar3) {
                pbVar9 = pbVar9 + -1;
                goto LAB_001274df;
              }
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                      ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                    *)&local_168,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(pbVar9->_M_dataplus)._M_p);
              if (bVar3) goto LAB_001274df;
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                      ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                    *)&local_168,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pbVar9[1]._M_dataplus._M_p);
              if (bVar3) {
                pbVar9 = pbVar9 + 1;
                goto LAB_001274df;
              }
              lVar10 = lVar10 + -1;
              lVar8 = lVar8 + -0x80;
              pbVar2 = pbVar9 + 4;
            } while (1 < lVar10);
            sVar11 = lVar8 >> 5;
            pbVar9 = pbVar9 + 2;
          }
          if (sVar11 == 1) {
LAB_001274f9:
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                    ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                  *)&local_168,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(pbVar9->_M_dataplus)._M_p);
            if (bVar3) goto LAB_001274df;
          }
          else {
            if (sVar11 == 2) {
LAB_001274a3:
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                      ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                    *)&local_168,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(pbVar9->_M_dataplus)._M_p);
              if (!bVar3) {
                pbVar9 = pbVar9 + 1;
                goto LAB_001274f9;
              }
            }
            else {
              if (sVar11 != 3) goto LAB_0012751e;
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                      ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                    *)&local_168,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(pbVar9->_M_dataplus)._M_p);
              if (!bVar3) {
                pbVar9 = pbVar9 + 1;
                goto LAB_001274a3;
              }
            }
LAB_001274df:
            if (pbVar9 != IgnoreList.Data + IgnoreList.Length) goto LAB_00127668;
          }
LAB_0012751e:
          local_160 = 0x8000000000;
          local_168 = local_158;
          SmallVectorImpl<char>::append<char_const*,void>
                    ((SmallVectorImpl<char> *)&local_168,local_1e8,local_1e8 + CStack_1e0.cString);
          Twine::Twine((Twine *)&local_210,&local_1a8);
          Twine::Twine(&local_180,"");
          Twine::Twine(&local_198,"");
          Twine::Twine(&local_d8,"");
          sys::path::append((SmallVectorImpl<char> *)&local_168,(Twine *)&local_210,&local_180,
                            &local_198,&local_d8);
          Twine::Twine((Twine *)&local_210,(SmallVectorImpl<char> *)&local_168);
          iVar4 = fs::access(&local_210.character,0);
          if (iVar4 == 0) {
            if (local_168 == (char **)0x0) {
              local_210.twine = (Twine *)&local_200;
              local_208 = 0;
              local_200._M_local_buf[0] = '\0';
            }
            else {
              local_210.twine = (Twine *)&local_200;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_210,local_168,(local_160 & 0xffffffff) + (long)local_168);
            }
            optional_detail::
            OptionalStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ::operator=(&__return_storage_ptr__->Storage,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210.twine != &local_200) {
              operator_delete(local_210.twine,
                              CONCAT71(local_200._M_allocated_capacity._1_7_,
                                       local_200._M_local_buf[0]) + 1);
            }
          }
          if (local_168 != local_158) {
            free(local_168);
          }
          if (iVar4 == 0) break;
        }
LAB_00127668:
        CVar12.twine = (Twine *)&(CVar12.twine)->LHSKind;
      } while (CVar12.twine != (Twine *)(pCVar1 + uVar6 * 2));
    }
    if (local_c0.twine != local_b0) {
      free(local_c0.twine);
    }
  }
  if (((local_1b0 & 1U) != 0) && (local_1d0 != local_1c0)) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Optional<std::string> Process::FindInEnvPath(StringRef EnvName,
                                             StringRef FileName,
                                             ArrayRef<std::string> IgnoreList) {
  assert(!path::is_absolute(FileName));
  Optional<std::string> FoundPath;
  Optional<std::string> OptPath = Process::GetEnv(EnvName);
  if (!OptPath.hasValue())
    return FoundPath;

  const char EnvPathSeparatorStr[] = {EnvPathSeparator, '\0'};
  SmallVector<StringRef, 8> Dirs;
  SplitString(OptPath.getValue(), Dirs, EnvPathSeparatorStr);

  for (StringRef Dir : Dirs) {
    if (Dir.empty())
      continue;

    if (any_of(IgnoreList, [&](StringRef S) { return fs::equivalent(S, Dir); }))
      continue;

    SmallString<128> FilePath(Dir);
    path::append(FilePath, FileName);
    if (fs::exists(Twine(FilePath))) {
      FoundPath = FilePath.str();
      break;
    }
  }

  return FoundPath;
}